

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O2

void PlayOrganObject(uchar key,int mode,char track,long freq)

{
  byte bVar1;
  AudioBackend_Sound *sound;
  byte bVar2;
  byte bVar3;
  
  if (audio_backend_initialised) {
    bVar2 = key / 0xc;
    bVar3 = key_twin[track];
    sound = lpORGANBUFFER[track][bVar2][bVar3];
    if (sound != (AudioBackend_Sound *)0x0) {
      if (mode == -1) {
        bVar1 = old_key[track];
        if (bVar1 == 0xff) {
          ChangeOrganFrequency(key % 0xc,track,freq);
          AudioBackend_PlaySound(lpORGANBUFFER[track][bVar2][key_twin[track]],true);
          old_key[track] = key;
          key_on[track] = '\x01';
        }
        else {
          if ((bVar1 == key) && (key_on[track] == '\x01')) {
            AudioBackend_PlaySound(sound,false);
            bVar3 = key_twin[track] + 1;
            if (1 < bVar3) {
              bVar3 = 0;
            }
            key_twin[track] = bVar3;
            AudioBackend_PlaySound(lpORGANBUFFER[track][bVar2][bVar3],true);
            return;
          }
          AudioBackend_PlaySound(lpORGANBUFFER[track][bVar1 / 0xc][bVar3],false);
          bVar3 = key_twin[track] + 1;
          if (1 < bVar3) {
            bVar3 = 0;
          }
          key_twin[track] = bVar3;
          ChangeOrganFrequency(key % 0xc,track,freq);
          AudioBackend_PlaySound(lpORGANBUFFER[track][bVar2][key_twin[track]],true);
          old_key[track] = key;
        }
      }
      else if (mode == 2) {
        if (old_key[track] != 0xff) {
          AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 0xc][bVar3],false);
          old_key[track] = 0xff;
        }
      }
      else if ((mode == 0) && (old_key[track] != 0xff)) {
        AudioBackend_StopSound(lpORGANBUFFER[track][old_key[track] / 0xc][bVar3]);
        AudioBackend_RewindSound(lpORGANBUFFER[track][old_key[track] / 0xc][key_twin[track]]);
        return;
      }
    }
  }
  return;
}

Assistant:

void PlayOrganObject(unsigned char key, int mode, signed char track, long freq)
{
	if (!audio_backend_initialised)
		return;

	if (lpORGANBUFFER[track][key / 12][key_twin[track]] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				if (old_key[track] != 0xFF)
				{
					AudioBackend_StopSound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]]);
					AudioBackend_RewindSound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]]);
				}
				break;

			case 1: // 再生 (Playback)
				break;

			case 2:	// 歩かせ停止 (Stop playback)
				if (old_key[track] != 0xFF)
				{
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);
					old_key[track] = 0xFF;
				}
				break;

			case -1:
				if (old_key[track] == 0xFF)	// 新規鳴らす (New sound)
				{
					ChangeOrganFrequency(key % 12, track, freq);	// 周波数を設定して (Set the frequency)
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
					old_key[track] = key;
					key_on[track] = 1;
				}
				else if (key_on[track] == 1 && old_key[track] == key)	// 同じ音 (Same sound)
				{
					// 今なっているのを歩かせ停止 (Stop playback now)
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);
					key_twin[track]++;
					if (key_twin[track] > 1)
						key_twin[track] = 0;
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
				}
				else	// 違う音を鳴らすなら (If you make a different sound)
				{
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);	// 今なっているのを歩かせ停止 (Stop playback now)
					key_twin[track]++;
					if (key_twin[track] > 1)
						key_twin[track] = 0;
					ChangeOrganFrequency(key % 12, track, freq);	// 周波数を設定して (Set the frequency)
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
					old_key[track] = key;
				}

				break;
		}
	}
}